

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UBool __thiscall
icu_63::Normalizer2Impl::hasCompBoundaryAfter
          (Normalizer2Impl *this,uint8_t *start,uint8_t *p,UBool onlyContiguous)

{
  byte bVar1;
  ushort uVar2;
  int32_t iVar3;
  uint uVar4;
  bool bVar5;
  
  bVar5 = true;
  if (start != p) {
    bVar1 = p[-1];
    uVar4 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      iVar3 = ucptrie_internalU8PrevIndex_63(this->normTrie,(uint)bVar1,start,p + -1);
      uVar4 = iVar3 >> 3;
    }
    uVar2 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)(int)uVar4 * 2);
    if ((uVar2 & 1) == 0) {
      bVar5 = false;
    }
    else if (onlyContiguous != '\0') {
      bVar5 = true;
      if (uVar2 != 1) {
        if (uVar2 < this->limitNoNo) {
          bVar5 = *(ushort *)((long)this->extraData + (ulong)(uVar2 & 0xfffffffe)) < 0x200;
        }
        else {
          bVar5 = (uVar2 & 6) < 3;
        }
      }
    }
  }
  return bVar5;
}

Assistant:

UBool Normalizer2Impl::hasCompBoundaryAfter(const uint8_t *start, const uint8_t *p,
                                            UBool onlyContiguous) const {
    if (start == p) {
        return TRUE;
    }
    uint16_t norm16;
    UCPTRIE_FAST_U8_PREV(normTrie, UCPTRIE_16, start, p, norm16);
    return norm16HasCompBoundaryAfter(norm16, onlyContiguous);
}